

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue2f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x,
               float y)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[2]> state;
  undefined1 local_1a8 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::StateQueryMemoryWriteGuard
            (&state);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                    (&state,testCtx);
  if (bVar1) {
    if ((state.m_value[0] == x) && (!NAN(state.m_value[0]) && !NAN(x))) {
      if ((state.m_value[1] == y) && (!NAN(state.m_value[1]) && !NAN(y))) {
        return;
      }
    }
    local_1a8._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: expected [");
    std::ostream::operator<<(this,x);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,y);
    std::operator<<((ostream *)this,"]; got [");
    std::ostream::operator<<(this,state.m_value[0]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,state.m_value[1]);
    std::operator<<((ostream *)this,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue2f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x, float y)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[2]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y
		<< "]; got ["
		<< state[0] << ", "
		<< state[1]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}